

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testAttributes.cpp
# Opt level: O0

void print_type<int>(TypedAttribute<int> *object)

{
  char *pcVar1;
  ostream *this;
  long *in_RDI;
  
  pcVar1 = (char *)(**(code **)(*in_RDI + 0x10))();
  this = std::operator<<((ostream *)&std::cout,pcVar1);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void
print_type (const OPENEXR_IMF_NAMESPACE::TypedAttribute<T>& object)
{
    cout << object.typeName () << endl;
}